

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Gia_Man_t * Gia_ManDupCollapse(Gia_Man_t *p,Gia_Man_t *pBoxes,Vec_Int_t *vBoxPres,int fSeq)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  int local_68;
  int local_64;
  int local_60;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  if ((fSeq != 0) && (p->vRegClasses == (Vec_Int_t *)0x0)) {
    __assert_fail("!fSeq || p->vRegClasses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x329,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  iVar16 = p->vCis->nSize;
  iVar2 = Tim_ManPiNum(p_00);
  if (iVar16 != iVar2 + pBoxes->vCos->nSize) {
    __assert_fail("Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x32b,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  pGVar7 = Gia_ManStart(p->nObjs);
  pcVar8 = Abc_UtilStrsav(p->pName);
  pGVar7->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  pGVar7->pSpec = pcVar8;
  if (p->pSibls != (int *)0x0) {
    piVar9 = (int *)calloc((long)p->nObjs,4);
    pGVar7->pSibls = piVar9;
  }
  Gia_ManHashAlloc(pGVar7);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (iVar16 = 0; iVar2 = Tim_ManPiNum(p_00), iVar16 < iVar2; iVar16 = iVar16 + 1) {
    pGVar10 = Gia_ManCi(p,iVar16);
    uVar3 = Gia_ManAppendCi(pGVar7);
    pGVar10->Value = uVar3;
    Gia_ObjSetTravIdCurrent(p,pGVar10);
  }
  iVar2 = Tim_ManPiNum(p_00);
  iVar16 = 0;
  local_64 = 0;
  local_68 = 0;
  local_60 = 0;
  for (iVar17 = 0; iVar4 = Tim_ManBoxNum(p_00), iVar17 < iVar4; iVar17 = iVar17 + 1) {
    Gia_ManIncrementTravId(pBoxes);
    Gia_ObjSetTravIdCurrent(pBoxes,pBoxes->pObjs);
    pBoxes->pObjs->Value = 0;
    iVar4 = Tim_ManBoxIsBlack(p_00,iVar17);
    if (iVar4 == 0) {
      for (iVar4 = 0; iVar6 = Tim_ManBoxInputNum(p_00,iVar17), iVar4 < iVar6; iVar4 = iVar4 + 1) {
        pGVar10 = Gia_ManCo(p,iVar16 + iVar4);
        Gia_ManDupCollapse_rec
                  (p,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar7);
        pGVar11 = Gia_ManCi(pBoxes,iVar4);
        uVar3 = Gia_ObjFanin0Copy(pGVar10);
        pGVar11->Value = uVar3;
        Gia_ObjSetTravIdCurrent(pBoxes,pGVar11);
      }
      iVar4 = iVar2;
      for (iVar6 = 0; iVar5 = Tim_ManBoxOutputNum(p_00,iVar17), iVar6 < iVar5; iVar6 = iVar6 + 1) {
        iVar5 = Tim_ManPiNum(p_00);
        pGVar10 = Gia_ManCo(pBoxes,iVar4 - iVar5);
        Gia_ManDupCollapse_rec
                  (pBoxes,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar7);
        pGVar11 = Gia_ManCi(p,iVar4);
        uVar3 = Gia_ObjFanin0Copy(pGVar10);
        pGVar11->Value = uVar3;
        Gia_ObjSetTravIdCurrent(p,pGVar11);
        iVar4 = iVar4 + 1;
      }
    }
    else {
      iVar4 = 0;
      if (vBoxPres == (Vec_Int_t *)0x0) {
        bVar18 = false;
      }
      else {
        iVar4 = Vec_IntEntry(vBoxPres,iVar17);
        bVar18 = iVar4 == 0;
        iVar4 = 0;
      }
      for (; iVar6 = Tim_ManBoxInputNum(p_00,iVar17), iVar4 < iVar6; iVar4 = iVar4 + 1) {
        pGVar10 = Gia_ManCo(p,iVar16 + iVar4);
        Gia_ManDupCollapse_rec
                  (p,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar7);
        uVar3 = 0xffffffff;
        if (bVar18 == false) {
          iVar6 = Gia_ObjFanin0Copy(pGVar10);
          uVar3 = Gia_ManAppendCo(pGVar7,iVar6);
        }
        pGVar10->Value = uVar3;
      }
      local_68 = local_68 + iVar4;
      for (iVar4 = 0; iVar6 = Tim_ManBoxOutputNum(p_00,iVar17), iVar4 < iVar6; iVar4 = iVar4 + 1) {
        pGVar10 = Gia_ManCi(p,iVar2 + iVar4);
        uVar3 = 0;
        if (bVar18 == false) {
          uVar3 = Gia_ManAppendCi(pGVar7);
        }
        pGVar10->Value = uVar3;
        Gia_ObjSetTravIdCurrent(p,pGVar10);
        local_60 = local_60 + (uint)(bVar18 ^ 1);
      }
      local_64 = local_64 + iVar4;
    }
    iVar4 = Tim_ManBoxInputNum(p_00,iVar17);
    iVar16 = iVar4 + iVar16;
    iVar4 = Tim_ManBoxOutputNum(p_00,iVar17);
    iVar2 = iVar4 + iVar2;
  }
  iVar17 = Tim_ManCoNum(p_00);
  iVar4 = Tim_ManPoNum(p_00);
  for (iVar17 = iVar17 - iVar4; iVar4 = Tim_ManCoNum(p_00), iVar17 < iVar4; iVar17 = iVar17 + 1) {
    pGVar10 = Gia_ManCo(p,iVar17);
    Gia_ManDupCollapse_rec(p,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar7);
    iVar4 = Gia_ObjFanin0Copy(pGVar10);
    uVar3 = Gia_ManAppendCo(pGVar7,iVar4);
    pGVar10->Value = uVar3;
  }
  iVar17 = Tim_ManPoNum(p_00);
  if (iVar2 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x37f,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if (iVar17 + iVar16 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x380,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if ((fSeq == 0) || (p->vRegClasses == (Vec_Int_t *)0x0)) {
    piVar9 = &p->nRegs;
  }
  else {
    piVar9 = &p->vRegClasses->nSize;
  }
  Gia_ManSetRegNum(pGVar7,*piVar9);
  Gia_ManHashStop(pGVar7);
  pGVar12 = Gia_ManCleanup(pGVar7);
  Gia_ManCleanupRemap(p,pGVar7);
  Gia_ManStop(pGVar7);
  pGVar7 = pGVar12;
  if (local_60 != 0) {
    iVar16 = Tim_ManPiNum(p_00);
    pGVar7 = Gia_ManDupMoveLast(pGVar12,iVar16 - pGVar12->nRegs,local_60);
    Gia_ManCleanupRemap(p,pGVar12);
    Gia_ManStop(pGVar12);
  }
  if (vBoxPres == (Vec_Int_t *)0x0) {
    iVar16 = Tim_ManPoNum(p_00);
    if (iVar16 != pGVar7->vCos->nSize - local_68) {
      __assert_fail("vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x395,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
    iVar16 = Tim_ManPiNum(p_00);
    if (iVar16 != pGVar7->vCis->nSize - local_64) {
      __assert_fail("vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x396,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
  }
  pGVar12 = pGVar7;
  if ((fSeq != 0) && (pVVar1 = p->vRegInits, pVVar1 != (Vec_Int_t *)0x0)) {
    uVar3 = pVVar1->nSize;
    uVar13 = 0;
    uVar14 = 0;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)uVar3;
    }
    iVar16 = 0;
    for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
      iVar16 = iVar16 + pVVar1->pArray[uVar13];
    }
    if (iVar16 != 0) {
      pcVar8 = (char *)malloc((long)(int)uVar3 + 1);
      if (uVar3 != pGVar7->nRegs) {
        __assert_fail("Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0x39d,
                      "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
      }
      for (lVar15 = 0; lVar15 < (int)uVar3; lVar15 = lVar15 + 1) {
        iVar16 = (int)lVar15;
        pGVar10 = Gia_ManCi(pGVar7,(pGVar7->vCis->nSize - uVar3) + iVar16);
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        iVar2 = Vec_IntEntry(p->vRegInits,iVar16);
        if (iVar2 == 0) {
          pcVar8[lVar15] = '0';
        }
        else {
          iVar16 = Vec_IntEntry(p->vRegInits,iVar16);
          if (iVar16 == 1) {
            pcVar8[lVar15] = '1';
          }
          else {
            pcVar8[lVar15] = 'X';
          }
        }
        uVar3 = pGVar7->nRegs;
      }
      pcVar8[lVar15] = '\0';
      pGVar12 = Gia_ManDupZeroUndc(pGVar7,pcVar8,0,0,1);
      pGVar12->nConstrs = pGVar7->nConstrs;
      pGVar7->nConstrs = 0;
      Gia_ManStop(pGVar7);
      free(pcVar8);
    }
  }
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManDupCollapse( Gia_Man_t * p, Gia_Man_t * pBoxes, Vec_Int_t * vBoxPres, int fSeq )
{
    // this procedure assumes that sequential AIG with boxes is unshuffled to have valid boxes
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjBox;
    int i, k, curCi, curCo, nBBins = 0, nBBouts = 0, nNewPis = 0;
    assert( !fSeq || p->vRegClasses );
    //assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManHashAlloc( pNew );
    // copy const and real PIs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // clean boxes
        Gia_ManIncrementTravId( pBoxes );
        Gia_ObjSetTravIdCurrent( pBoxes, Gia_ManConst0(pBoxes) );
        Gia_ManConst0(pBoxes)->Value = 0;
        // add internal nodes
        //printf( "%d ", Tim_ManBoxIsBlack(pManTime, i) );
        if ( Tim_ManBoxIsBlack(pManTime, i) )
        {
            int fSkip = (vBoxPres != NULL && !Vec_IntEntry(vBoxPres, i));
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                pObj->Value = fSkip ? -1 : Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                nBBouts++;
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = fSkip ? 0 : Gia_ManAppendCi(pNew);
                Gia_ObjSetTravIdCurrent( p, pObj );
                nBBins++;
                nNewPis += !fSkip;
            }
        }
        else
        {
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                // build logic
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                // transfer to the PI
                pObjBox = Gia_ManCi( pBoxes, k );
                pObjBox->Value = Gia_ObjFanin0Copy(pObj);
                Gia_ObjSetTravIdCurrent( pBoxes, pObjBox );
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                // build logic
                pObjBox = Gia_ManCo( pBoxes, curCi - Tim_ManPiNum(pManTime) + k );
                Gia_ManDupCollapse_rec( pBoxes, Gia_ObjFanin0(pObjBox), pNew );
                // transfer to the PI
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = Gia_ObjFanin0Copy(pObjBox);
                Gia_ObjSetTravIdCurrent( p, pObj );
            }
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    //printf( "\n" );
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    Gia_ManSetRegNum( pNew, (fSeq && p->vRegClasses) ? Vec_IntSize(p->vRegClasses) : Gia_ManRegNum(p) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManCleanupRemap( p, pTemp );
    Gia_ManStop( pTemp );
    if ( nNewPis )
    {
        pNew = Gia_ManDupMoveLast( pTemp = pNew, Tim_ManPiNum(pManTime)-Gia_ManRegNum(pNew), nNewPis );
        Gia_ManCleanupRemap( p, pTemp );
        Gia_ManStop( pTemp );
    }
/*
    printf( "%d = %d - %d    Diff = %d\n", 
        Tim_ManPoNum(pManTime),   Gia_ManCoNum(pNew),  nBBouts, 
        Tim_ManPoNum(pManTime) - (Gia_ManCoNum(pNew) - nBBouts) );

    printf( "%d = %d - %d    Diff = %d\n\n", 
        Tim_ManPiNum(pManTime),   Gia_ManCiNum(pNew),  nBBins, 
        Tim_ManPiNum(pManTime) - (Gia_ManCiNum(pNew) - nBBins) );
*/
    assert( vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts );
    assert( vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins );
    // implement initial state if given
    if ( fSeq && p->vRegInits && Vec_IntSum(p->vRegInits) )
    {
        char * pInit = ABC_ALLOC( char, Vec_IntSize(p->vRegInits) + 1 );
        Gia_Obj_t * pObj;
        int i;
        assert( Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew) );
        Gia_ManForEachRo( pNew, pObj, i )
        {
            if ( Vec_IntEntry(p->vRegInits, i) == 0 )
                pInit[i] = '0';
            else if ( Vec_IntEntry(p->vRegInits, i) == 1 )
                pInit[i] = '1';
            else 
                pInit[i] = 'X';
        }
        pInit[i] = 0;
        pNew = Gia_ManDupZeroUndc( pTemp = pNew, pInit, 0, 0, 1 );
        pNew->nConstrs = pTemp->nConstrs; pTemp->nConstrs = 0;
        Gia_ManStop( pTemp );
        ABC_FREE( pInit );
    }
    return pNew;
}